

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml.c
# Opt level: O2

uint8_t xml_parser_peek(xml_parser *parser,size_t n)

{
  ulong uVar1;
  ushort **ppuVar2;
  size_t sVar3;
  
  sVar3 = parser->position;
  uVar1 = parser->length;
  do {
    if (uVar1 <= sVar3) {
      return '\0';
    }
    ppuVar2 = __ctype_b_loc();
    if ((*(byte *)((long)*ppuVar2 + (ulong)parser->buffer[sVar3] * 2 + 1) & 0x20) == 0) {
      if (n == 0) {
        return parser->buffer[sVar3];
      }
      n = 0;
    }
    sVar3 = sVar3 + 1;
  } while( true );
}

Assistant:

static uint8_t xml_parser_peek(struct xml_parser* parser, size_t n) {
	size_t position = parser->position;

	while (position < parser->length) {
		if (!isspace(parser->buffer[position])) {
			if (n == 0) {
				return parser->buffer[position];
			} else {
				--n;
			}
		}

		position++;
	}

	return 0;
}